

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O1

void INT_CManager_close(CManager_conflict cm)

{
  void **ppvVar1;
  FILE *pFVar2;
  CMPollFunc *pp_Var3;
  __pid_t _Var4;
  int iVar5;
  pthread_t pVar6;
  pthread_t pVar7;
  func_entry *pfVar8;
  func_entry *pfVar9;
  ulong uVar10;
  long lVar11;
  CMControlList p_Var12;
  func_entry *shutdown_functions;
  timespec ts;
  timespec local_48;
  CMControlList local_38;
  
  p_Var12 = cm->control_list;
  if (cm->CMTrace_file == (FILE *)0x0) {
    iVar5 = CMtrace_init(cm,CMFreeVerbose);
    if (iVar5 == 0) goto LAB_00118b99;
  }
  else if (CMtrace_val[7] == 0) goto LAB_00118b99;
  if (CMtrace_PID != 0) {
    pFVar2 = (FILE *)cm->CMTrace_file;
    _Var4 = getpid();
    pVar7 = pthread_self();
    fprintf(pFVar2,"P%lxT%lx - ",(long)_Var4,pVar7);
  }
  if (CMtrace_timing != 0) {
    clock_gettime(1,&local_48);
    fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_48.tv_sec,local_48.tv_nsec);
  }
  fprintf((FILE *)cm->CMTrace_file,"CManager %p closing, ref count %d\n",cm,
          (ulong)(uint)cm->reference_count);
LAB_00118b99:
  fflush((FILE *)cm->CMTrace_file);
  iVar5 = CMtrace_val[7];
  if (cm->CMTrace_file == (FILE *)0x0) {
    iVar5 = CMtrace_init(cm,CMFreeVerbose);
  }
  if (iVar5 != 0) {
    if (CMtrace_PID != 0) {
      pFVar2 = (FILE *)cm->CMTrace_file;
      _Var4 = getpid();
      pVar7 = pthread_self();
      fprintf(pFVar2,"P%lxT%lx - ",(long)_Var4,pVar7);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,&local_48);
      fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_48.tv_sec,local_48.tv_nsec);
    }
    fprintf((FILE *)cm->CMTrace_file,
            "CMControlList close CL=%p current reference count will be %d, sdp = %p\n",p_Var12,
            (ulong)(p_Var12->cl_reference_count - 1),p_Var12->select_data);
  }
  fflush((FILE *)cm->CMTrace_file);
  p_Var12->cl_reference_count = p_Var12->cl_reference_count + -1;
  p_Var12->closed = 1;
  ppvVar1 = &p_Var12->select_data;
  (*p_Var12->stop_select)(&CMstatic_trans_svcs,ppvVar1);
  if ((0 < p_Var12->has_thread) &&
     (pVar7 = p_Var12->server_thread, pVar6 = pthread_self(), pVar7 != pVar6)) {
    (*p_Var12->wake_select)(&CMstatic_trans_svcs,ppvVar1);
  }
  if ((0 < p_Var12->has_thread) &&
     (pVar7 = p_Var12->server_thread, pVar6 = pthread_self(), pVar7 != pVar6)) {
    (*p_Var12->stop_select)(&CMstatic_trans_svcs,ppvVar1);
    (*p_Var12->wake_select)(&CMstatic_trans_svcs,ppvVar1);
    IntCManager_unlock(cm,
                       "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cm.c"
                       ,0x57c);
    pthread_join(p_Var12->server_thread,(void **)&local_48);
    IntCManager_lock(cm,
                     "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cm.c"
                     ,0x57e);
    p_Var12->has_thread = 0;
  }
  iVar5 = CMtrace_val[7];
  if (cm->CMTrace_file == (FILE *)0x0) {
    iVar5 = CMtrace_init(cm,CMFreeVerbose);
  }
  if (iVar5 != 0) {
    if (CMtrace_PID != 0) {
      pFVar2 = (FILE *)cm->CMTrace_file;
      _Var4 = getpid();
      pVar7 = pthread_self();
      fprintf(pFVar2,"P%lxT%lx - ",(long)_Var4,pVar7);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,&local_48);
      fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_48.tv_sec,local_48.tv_nsec);
    }
    fprintf((FILE *)cm->CMTrace_file,"CMControlList CL=%p is closed\n",p_Var12);
  }
  local_38 = p_Var12;
  fflush((FILE *)cm->CMTrace_file);
  iVar5 = cm->connection_count;
  while (iVar5 != 0) {
    iVar5 = CMtrace_val[7];
    if (cm->CMTrace_file == (FILE *)0x0) {
      iVar5 = CMtrace_init(cm,CMFreeVerbose);
    }
    if (iVar5 != 0) {
      if (CMtrace_PID != 0) {
        pFVar2 = (FILE *)cm->CMTrace_file;
        _Var4 = getpid();
        pVar7 = pthread_self();
        fprintf(pFVar2,"P%lxT%lx - ",(long)_Var4,pVar7);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,&local_48);
        fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_48.tv_sec,local_48.tv_nsec);
      }
      fprintf((FILE *)cm->CMTrace_file,"CManager in close, closing connection %p , ref count %d\n",
              *cm->connections,(ulong)(uint)(*cm->connections)->conn_ref_count);
    }
    fflush((FILE *)cm->CMTrace_file);
    internal_connection_close(*cm->connections);
    INT_CMConnection_failed(*cm->connections);
    iVar5 = cm->connection_count;
  }
  pfVar9 = cm->shutdown_functions;
  if ((pfVar9 != (func_entry *)0x0) && (pfVar9->func != (CMPollFunc)0x0)) {
    uVar10 = 0;
    do {
      if (pfVar9->task_type == 1) {
        iVar5 = CMtrace_val[7];
        if (cm->CMTrace_file == (FILE *)0x0) {
          iVar5 = CMtrace_init(cm,CMFreeVerbose);
        }
        if (iVar5 != 0) {
          if (CMtrace_PID != 0) {
            pFVar2 = (FILE *)cm->CMTrace_file;
            _Var4 = getpid();
            pVar7 = pthread_self();
            fprintf(pFVar2,"P%lxT%lx - ",(long)_Var4,pVar7);
          }
          if (CMtrace_timing != 0) {
            clock_gettime(1,&local_48);
            fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_48.tv_sec,local_48.tv_nsec);
          }
          fprintf((FILE *)cm->CMTrace_file,"CManager calling shutdown function SHUTDOWN %d, %p\n",
                  uVar10,pfVar9->func);
        }
        fflush((FILE *)cm->CMTrace_file);
        (*pfVar9->func)(cm,pfVar9->client_data);
        pfVar9->task_type = 0;
      }
      uVar10 = (ulong)((int)uVar10 + 1);
      pfVar8 = pfVar9 + 1;
      pfVar9 = pfVar9 + 1;
    } while (pfVar8->func != (CMPollFunc)0x0);
  }
  cm->reference_count = cm->reference_count + -1;
  iVar5 = CMtrace_val[7];
  if (cm->CMTrace_file == (FILE *)0x0) {
    iVar5 = CMtrace_init(cm,CMFreeVerbose);
  }
  p_Var12 = local_38;
  if (iVar5 != 0) {
    if (CMtrace_PID != 0) {
      pFVar2 = (FILE *)cm->CMTrace_file;
      _Var4 = getpid();
      pVar7 = pthread_self();
      fprintf(pFVar2,"P%lxT%lx - ",(long)_Var4,pVar7);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,&local_48);
      fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_48.tv_sec,local_48.tv_nsec);
    }
    fprintf((FILE *)cm->CMTrace_file,"CManager %p ref count now %d\n",cm,
            (ulong)(uint)cm->reference_count);
  }
  fflush((FILE *)cm->CMTrace_file);
  if (cm->reference_count == 0) {
    pfVar9 = cm->shutdown_functions;
    if (pfVar9 != (func_entry *)0x0) {
      cm->shutdown_functions = (func_entry *)0x0;
      lVar11 = 2;
      pfVar8 = pfVar9;
      do {
        lVar11 = lVar11 + -1;
        pp_Var3 = &pfVar8->func;
        pfVar8 = pfVar8 + 1;
      } while (*pp_Var3 != (CMPollFunc)0x0);
      if (lVar11 != 1) {
        uVar10 = -lVar11;
        do {
          if (pfVar9[uVar10 & 0xffffffff].task_type == 2) {
            pfVar8 = pfVar9 + (uVar10 & 0xffffffff);
            iVar5 = CMtrace_val[7];
            if (cm->CMTrace_file == (FILE *)0x0) {
              iVar5 = CMtrace_init(cm,CMFreeVerbose);
            }
            if (iVar5 != 0) {
              if (CMtrace_PID != 0) {
                pFVar2 = (FILE *)cm->CMTrace_file;
                _Var4 = getpid();
                pVar7 = pthread_self();
                fprintf(pFVar2,"P%lxT%lx - ",(long)_Var4,pVar7);
              }
              if (CMtrace_timing != 0) {
                clock_gettime(1,&local_48);
                fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_48.tv_sec,local_48.tv_nsec);
              }
              fprintf((FILE *)cm->CMTrace_file,"CManager calling shutdown function FREE %d, %p\n",
                      uVar10 & 0xffffffff,pfVar8->func);
            }
            fflush((FILE *)cm->CMTrace_file);
            (*pfVar8->func)(cm,pfVar8->client_data);
            pfVar8->func = (CMPollFunc)0x0;
          }
          lVar11 = uVar10 + 1;
          uVar10 = uVar10 - 1;
        } while (1 < lVar11);
      }
      INT_CMfree(pfVar9);
      p_Var12 = local_38;
    }
    iVar5 = CMtrace_val[7];
    if (cm->CMTrace_file == (FILE *)0x0) {
      iVar5 = CMtrace_init(cm,CMFreeVerbose);
    }
    if (iVar5 != 0) {
      if (CMtrace_PID != 0) {
        pFVar2 = (FILE *)cm->CMTrace_file;
        _Var4 = getpid();
        pVar7 = pthread_self();
        fprintf(pFVar2,"P%lxT%lx - ",(long)_Var4,pVar7);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,&local_48);
        fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_48.tv_sec,local_48.tv_nsec);
      }
      fprintf((FILE *)cm->CMTrace_file,"Freeing CManager %p\n",cm);
    }
    fflush((FILE *)cm->CMTrace_file);
    p_Var12->free_reference_count = 0;
    if (CMtrace_val[7] != 0) {
      fprintf((FILE *)cm->CMTrace_file,"CMControlList_free, %p, ref count now %d\n",p_Var12,0);
    }
    if (p_Var12->free_reference_count == 0) {
      if (CMtrace_val[7] != 0) {
        fprintf((FILE *)cm->CMTrace_file,"CMControlList_free freeing %p\n",p_Var12);
      }
      if (p_Var12->polling_function_list != (func_entry *)0x0) {
        INT_CMfree(p_Var12->polling_function_list);
      }
      pthread_mutex_destroy((pthread_mutex_t *)&p_Var12->list_mutex);
      internal_condition_free(p_Var12);
      INT_CMfree(p_Var12);
    }
    IntCManager_unlock(cm,
                       "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cm.c"
                       ,0x3db);
    CManager_free(cm);
  }
  else {
    IntCManager_unlock(cm,
                       "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cm.c"
                       ,0x3de);
  }
  return;
}

Assistant:

extern void
 INT_CManager_close(CManager cm)
 {
     CMControlList cl = cm->control_list;

     CMtrace_out(cm, CMFreeVerbose, "CManager %p closing, ref count %d\n", cm,
		 cm->reference_count);

     CMtrace_out(cm, CMFreeVerbose, "CMControlList close CL=%p current reference count will be %d, sdp = %p\n", 
		 cl, cl->cl_reference_count - 1, cl->select_data);
     INT_CMControlList_close(cl, cm);
     CMtrace_out(cm, CMFreeVerbose, "CMControlList CL=%p is closed\n", cl);

     while (cm->connection_count != 0) {
	 /* connections are moved down as they are closed... */
	 CMtrace_out(cm, CMFreeVerbose, "CManager in close, closing connection %p , ref count %d\n", cm->connections[0],
		     cm->connections[0]->conn_ref_count);
	 internal_connection_close(cm->connections[0]);
	 INT_CMConnection_failed(cm->connections[0]);
     }

     if (cm->shutdown_functions != NULL) {
	 func_entry *shutdown_functions = cm->shutdown_functions;
	 int i = 0;

	 while (shutdown_functions[i].func != NULL) {
	     if (shutdown_functions[i].task_type == SHUTDOWN_TASK) {
		 CMtrace_out(cm, CMFreeVerbose, "CManager calling shutdown function SHUTDOWN %d, %p\n", i, shutdown_functions[i].func);
		 shutdown_functions[i].func(cm, shutdown_functions[i].client_data);
		 shutdown_functions[i].task_type = NO_TASK;
	     }
	     i++;
	 }
     }
     cm->reference_count--;
     CMtrace_out(cm, CMFreeVerbose, "CManager %p ref count now %d\n", 
		 cm, cm->reference_count);
     if (cm->reference_count == 0) {
	 if (cm->shutdown_functions != NULL) {
	     int i = 0;
	     func_entry *shutdown_functions = cm->shutdown_functions;
	     cm->shutdown_functions = NULL;

	     while (shutdown_functions[i].func != NULL) {
		 i++;
	     }
	     i--;
	     for ( ; i >= 0; i--) {
		 if (shutdown_functions[i].task_type == FREE_TASK) {
		     CMtrace_out(cm, CMFreeVerbose, "CManager calling shutdown function FREE %d, %p\n", i, shutdown_functions[i].func);
		     shutdown_functions[i].func(cm, shutdown_functions[i].client_data);
		     shutdown_functions[i].func = NULL;
		 }
	     }
	     INT_CMfree(shutdown_functions);
	 }
	 CMtrace_out(cm, CMFreeVerbose, "Freeing CManager %p\n", cm);
	 cl->free_reference_count = 1;
	 CMControlList_free(cm, cl);
	 CManager_unlock(cm);
	 CManager_free(cm);
     } else {
	 CManager_unlock(cm);
     }
 }